

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_router.cpp
# Opt level: O3

void __thiscall InfoRouter::RemoveFunc(InfoRouter *this,string *name)

{
  pointer psVar1;
  long lVar2;
  long lVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  psVar1 = (this->_func_thread_vec).
           super__Vector_base<std::shared_ptr<FuncThread>,_std::allocator<std::shared_ptr<FuncThread>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->_func_thread_vec).
                              super__Vector_base<std::shared_ptr<FuncThread>,_std::allocator<std::shared_ptr<FuncThread>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      FuncThread::RemoveFunc
                (*(FuncThread **)
                  ((long)&(psVar1->super___shared_ptr<FuncThread,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + lVar3),name);
      lVar2 = lVar2 + 1;
      psVar1 = (this->_func_thread_vec).
               super__Vector_base<std::shared_ptr<FuncThread>,_std::allocator<std::shared_ptr<FuncThread>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < (int)((ulong)((long)(this->_func_thread_vec).
                                         super__Vector_base<std::shared_ptr<FuncThread>,_std::allocator<std::shared_ptr<FuncThread>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1)
                          >> 4));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void InfoRouter::RemoveFunc(const std::string& name) {
    std::unique_lock<std::mutex> lock(_mutex);
    for (int i = 0; i < (int)_func_thread_vec.size(); i++) {
        _func_thread_vec[i]->RemoveFunc(name);
    }
}